

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O0

FT_Bool ft_raccess_rule_by_darwin_vfs(FT_Library library,FT_UInt rule_index)

{
  FT_RFork_Rule FVar1;
  FT_UInt rule_index_local;
  FT_Library library_local;
  
  FVar1 = raccess_get_rule_type_from_rule_index(library,rule_index);
  library_local._7_1_ =
       FVar1 == FT_RFork_Rule_darwin_newvfs || FVar1 == FT_RFork_Rule_darwin_hfsplus;
  return library_local._7_1_;
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  ft_raccess_rule_by_darwin_vfs( FT_Library  library,
                                 FT_UInt     rule_index )
  {
    switch( raccess_get_rule_type_from_rule_index( library, rule_index ) )
    {
      case FT_RFork_Rule_darwin_newvfs:
      case FT_RFork_Rule_darwin_hfsplus:
        return TRUE;

      default:
        return FALSE;
    }
  }